

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_image_format(rf_image *__return_storage_ptr__,rf_image image,
               rf_uncompressed_pixel_format new_format,rf_allocator allocator)

{
  long lVar1;
  rf_source_location source_location;
  rf_image image_00;
  rf_pixel_format src_format;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  void *dst_00;
  long *in_FS_OFFSET;
  undefined8 uVar5;
  undefined4 uStack_104;
  undefined4 uStack_cc;
  undefined4 uStack_94;
  undefined4 uStack_64;
  _Bool format_success;
  void *dst;
  int dst_size;
  rf_uncompressed_pixel_format new_format_local;
  rf_allocator allocator_local;
  
  allocator_local.user_data = allocator.allocator_proc;
  _dst_size = allocator.user_data;
  memset(__return_storage_ptr__,0,0x18);
  if (((undefined1  [24])image & (undefined1  [24])0x100000000) == (undefined1  [24])0x0) {
    rf_log_impl(8,0x1b291e,(char *)0x1);
    lVar1 = *in_FS_OFFSET;
    *(char **)(lVar1 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar1 + -0x458) = "rf_image_format";
    *(undefined8 *)(lVar1 + -0x450) = 0x3eb6;
    *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_104,1);
  }
  else {
    _Var2 = rf_is_uncompressed_format(new_format);
    src_format = image.format;
    if ((_Var2) && (_Var2 = rf_is_uncompressed_format(image.format), _Var2)) {
      iVar3 = rf_bytes_per_pixel(image.format);
      uVar4 = image.width * image.height * iVar3;
      uVar5 = 0;
      dst_00 = (void *)(*(code *)allocator_local.user_data)(&dst_size,1);
      if (dst_00 == (void *)0x0) {
        rf_log_impl(8,0x1b25a7,(char *)0x2,(ulong)uVar4);
        lVar1 = *in_FS_OFFSET;
        *(char **)(lVar1 + -0x460) =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        *(char **)(lVar1 + -0x458) = "rf_image_format";
        *(undefined8 *)(lVar1 + -0x450) = 0x3eb2;
        *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_94,2);
      }
      else {
        image_00.format = (int)uVar5;
        image_00.valid = (_Bool)(char)((ulong)uVar5 >> 0x20);
        image_00._21_3_ = (int3)((ulong)uVar5 >> 0x28);
        image_00._0_16_ = image._8_16_;
        iVar3 = rf_image_size(image_00);
        rf_format_pixels(image.data,(long)iVar3,src_format,dst_00,(long)(int)uVar4,new_format);
        __return_storage_ptr__->data = dst_00;
        __return_storage_ptr__->width = image.width;
        __return_storage_ptr__->height = image.height;
        __return_storage_ptr__->format = new_format;
        __return_storage_ptr__->valid = true;
        *(undefined3 *)&__return_storage_ptr__->field_0x15 = uStack_64._1_3_;
      }
    }
    else {
      source_location.proc_name = "rf_image_format";
      source_location.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location.line_in_file = 0x3eb4;
      rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                  "Cannot format compressed pixel formats. `image.format`: %d, `dst_format`: %d",1,
                  (ulong)image.format,(ulong)new_format,"rf_image_format");
      lVar1 = *in_FS_OFFSET;
      *(char **)(lVar1 + -0x460) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(lVar1 + -0x458) = "rf_image_format";
      *(undefined8 *)(lVar1 + -0x450) = 0x3eb4;
      *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_cc,1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_format(rf_image image, rf_uncompressed_pixel_format new_format, rf_allocator allocator)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (rf_is_uncompressed_format(new_format) && rf_is_uncompressed_format(image.format))
        {
            int dst_size = image.width * image.height * rf_bytes_per_pixel(image.format);
            void* dst = RF_ALLOC(allocator, dst_size);

            if (dst)
            {
                bool format_success = rf_format_pixels(image.data, rf_image_size(image), image.format, dst, dst_size, new_format);
                RF_ASSERT(format_success);

                result = (rf_image)
                {
                    .data = dst,
                    .width = image.width,
                    .height = image.height,
                    .format = new_format,
                    .valid = true,
                };
            }
            else RF_LOG_ERROR(RF_BAD_ALLOC, "Allocation of size %d failed.", dst_size);
        }
        else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Cannot format compressed pixel formats. `image.format`: %d, `dst_format`: %d", image.format, new_format);
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image is invalid.");

    return result;
}